

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackMemory.cpp
# Opt level: O0

void __thiscall
Lodtalk::StackPage::StackPage(StackPage *this,VMContext *context,uint8_t *memoryLocation)

{
  StackFrame local_30;
  uint8_t *local_20;
  uint8_t *memoryLocation_local;
  VMContext *context_local;
  StackPage *this_local;
  
  this->context = context;
  local_20 = memoryLocation;
  memoryLocation_local = (uint8_t *)context;
  context_local = (VMContext *)this;
  StackFrame::StackFrame(&this->headFrame,(uint8_t *)0x0,(uint8_t *)0x0);
  this->stackPageSize = 0x2000;
  this->stackPageLowest = local_20;
  this->stackPageHighest = this->stackPageLowest + this->stackPageSize;
  this->baseFramePointer = (uint8_t *)0x0;
  this->overflowLimit = this->stackPageLowest + 0x2e8;
  this->stackLimit = this->overflowLimit;
  StackFrame::StackFrame(&local_30,(uint8_t *)0x0,(uint8_t *)0x0);
  (this->headFrame).framePointer = local_30.framePointer;
  (this->headFrame).stackPointer = local_30.stackPointer;
  StackFrame::~StackFrame(&local_30);
  this->previousPage = (StackPage *)0x0;
  this->nextPage = (StackPage *)0x0;
  return;
}

Assistant:

StackPage::StackPage(VMContext *context, uint8_t *memoryLocation)
    : context(context)
{
    stackPageSize = StackMemoryPageSize;

    stackPageLowest = memoryLocation;
    stackPageHighest = stackPageLowest + stackPageSize;
    baseFramePointer = nullptr;

    overflowLimit = stackPageLowest + Context::LargeContextSlots*sizeof(void*)*3/2;
    stackLimit = overflowLimit;

    headFrame = StackFrame(nullptr, nullptr);
    previousPage = nullptr;
    nextPage = nullptr;
}